

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILS.h
# Opt level: O1

void __thiscall imrt::ApertureILS::ApertureILS(ApertureILS *this,ApertureILS *ils)

{
  double dVar1;
  int iVar2;
  
  (this->super_ILS)._vptr_ILS = (_func_int **)&PTR__ILS_0013ccc8;
  (this->super_ILS).max_no_improvement = 100.0;
  iVar2 = (ils->super_ILS).vsize;
  (this->super_ILS).bsize = (ils->super_ILS).bsize;
  (this->super_ILS).vsize = iVar2;
  (this->super_ILS).acceptance = (ils->super_ILS).acceptance;
  (this->super_ILS)._vptr_ILS = (_func_int **)&PTR__ApertureILS_0013cc30;
  (this->tabu).
  super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->tabu;
  (this->tabu).
  super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->tabu;
  (this->tabu).
  super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->super_ILS).field_0x24 = (ils->super_ILS).field_0x24;
  (this->super_ILS).field_0x25 = (ils->super_ILS).field_0x25;
  this->prob_intensity = ils->prob_intensity;
  this->step_intensity = ils->step_intensity;
  this->alpha = ils->alpha;
  this->do_perturbate = ils->do_perturbate;
  this->perturbation_size = ils->perturbation_size;
  this->ls_type = ils->ls_type;
  dVar1 = ils->initial_temperature;
  this->temperature = ils->temperature;
  this->initial_temperature = dVar1;
  return;
}

Assistant:

ILS(const ILS & ils ){
    bsize=ils.bsize;
    vsize=ils.vsize;
    acceptance=ils.acceptance;
  }